

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O1

AssertionResult * __thiscall
iutest::internal::CmpHelperNear<int,double>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expr1,char *expr2,char *absc
          ,int *val1,int *val2,double *abs_v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  uint uVar3;
  AssertionResult *pAVar4;
  int *piVar5;
  undefined1 local_8c [4];
  char *local_88;
  char *local_80;
  internal *local_78;
  string local_70;
  AssertionResult local_50;
  
  uVar3 = *(int *)absc - *val1;
  local_8c = (undefined1  [4])-uVar3;
  if (0 < (int)uVar3) {
    local_8c = (undefined1  [4])uVar3;
  }
  piVar5 = (int *)(ulong)(uint)local_8c;
  if (*(double *)val2 < (double)(int)local_8c) {
    paVar1 = &local_50.m_message.field_2;
    local_50.m_message._M_string_length = 0;
    local_50.m_message.field_2._M_local_buf[0] = '\0';
    local_50.m_result = false;
    local_88 = expr2;
    local_80 = expr1;
    local_78 = this;
    local_50.m_message._M_dataplus._M_p = (pointer)paVar1;
    pAVar4 = AssertionResult::operator<<(&local_50,(char (*) [22])"error: Value of: abs(");
    pAVar4 = AssertionResult::operator<<(pAVar4,(char **)&local_78);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [4])" - ");
    pAVar4 = AssertionResult::operator<<(pAVar4,&local_80);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [6])") <= ");
    pAVar4 = AssertionResult::operator<<(pAVar4,&local_88);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [16])"\n  Actual: abs(");
    pAVar4 = AssertionResult::operator<<(pAVar4,(int *)absc);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [4])" - ");
    pAVar4 = AssertionResult::operator<<(pAVar4,val1);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [5])") : ");
    pAVar4 = AssertionResult::operator<<(pAVar4,(int *)local_8c);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [12])"\nExpected: ");
    FormatForComparisonFailureMessage<double,int>
              (&local_70,(internal *)val2,(double *)local_8c,piVar5);
    pAVar4 = AssertionResult::operator<<(pAVar4,&local_70);
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    pcVar2 = (pAVar4->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar4->m_message)._M_string_length
              );
    __return_storage_ptr__->m_result = pAVar4->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.m_message._M_dataplus._M_p,
                      CONCAT71(local_50.m_message.field_2._M_allocated_capacity._1_7_,
                               local_50.m_message.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperNear(
    const char* expr1, const char* expr2, const char* absc
        , const T& val1, const T& val2, const A& abs_v)
{
    const T diff = val1 > val2 ? val1 - val2 : val2 - val1;
    if IUTEST_COND_LIKELY( diff <= abs_v )
    {
        return AssertionSuccess();
    }